

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O0

void __thiscall MemVector<unsigned_int>::~MemVector(MemVector<unsigned_int> *this)

{
  MemVector<unsigned_int> *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->accesses_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->vec_);
  return;
}

Assistant:

MemVector() {}